

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_mthd.c
# Opt level: O3

void decode_nvrm_mthd_context_list_devices(nvrm_mthd_context_list_devices *m)

{
  ulong uVar1;
  
  uVar1 = 0;
  do {
    if (1 < m->gpu_id[uVar1] + 1) {
      fprintf(_stdout,"gpu_id[%d]: 0x%08x ",uVar1 & 0xffffffff);
    }
    uVar1 = uVar1 + 1;
  } while (uVar1 != 0x20);
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_nvrm_mthd_context_list_devices(struct nvrm_mthd_context_list_devices *m)
{
	int j;
	for (j = 0; j < 32; ++j)
		if (m->gpu_id[j] != 0 && m->gpu_id[j] != 0xffffffff)
			mmt_log_cont("gpu_id[%d]: 0x%08x ", j, m->gpu_id[j]);
	nvrm_print_ln();
}